

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O2

void Vec_WrdFillExtra(Vec_Wrd_t *p,int nSize,word Fill)

{
  int iVar1;
  long lVar2;
  int nCapMin;
  
  if (p->nSize < nSize) {
    iVar1 = p->nCap * 2;
    nCapMin = nSize;
    if ((iVar1 < nSize) || (nCapMin = iVar1, p->nCap < nSize)) {
      Vec_WrdGrow(p,nCapMin);
    }
    for (lVar2 = (long)p->nSize; lVar2 < nSize; lVar2 = lVar2 + 1) {
      p->pArray[lVar2] = 0;
    }
    p->nSize = nSize;
  }
  return;
}

Assistant:

static inline void Vec_WrdFillExtra( Vec_Wrd_t * p, int nSize, word Fill )
{
    int i;
    if ( nSize <= p->nSize )
        return;
    if ( nSize > 2 * p->nCap )
        Vec_WrdGrow( p, nSize );
    else if ( nSize > p->nCap )
        Vec_WrdGrow( p, 2 * p->nCap );
    for ( i = p->nSize; i < nSize; i++ )
        p->pArray[i] = Fill;
    p->nSize = nSize;
}